

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsEndpointAddSourceTarget(HelicsEndpoint end,char *targetEndpoint,HelicsError *err)

{
  Interface *this;
  size_t sVar1;
  string_view newTarget;
  
  if (err == (HelicsError *)0x0) {
    if (end == (HelicsEndpoint)0x0) {
      return;
    }
    if (*(int *)((long)end + 0x20) != -0x4bac6b3e) {
      return;
    }
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((end == (HelicsEndpoint)0x0) || (*(int *)((long)end + 0x20) != -0x4bac6b3e)) {
      err->error_code = -3;
      err->message = "The given endpoint does not point to a valid object";
      return;
    }
  }
  this = *end;
  sVar1 = strlen(targetEndpoint);
  newTarget._M_str = targetEndpoint;
  newTarget._M_len = sVar1;
  helics::Interface::addSourceTarget(this,newTarget,UNKNOWN);
  return;
}

Assistant:

void helicsEndpointAddSourceTarget(HelicsEndpoint end, const char* targetEndpoint, HelicsError* err)
{
    auto* endObj = verifyEndpoint(end, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->addSourceTarget(targetEndpoint);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}